

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

ExtensionRange * __thiscall
google::protobuf::Descriptor::FindExtensionRangeContainingNumber(Descriptor *this,int number)

{
  ExtensionRange *pEVar1;
  int i;
  long lVar2;
  
  pEVar1 = *(ExtensionRange **)(this + 0x70);
  lVar2 = 0;
  while( true ) {
    if (*(int *)(this + 0x68) <= lVar2) {
      return (ExtensionRange *)0x0;
    }
    if ((pEVar1->start <= number) && (number < pEVar1->end)) break;
    lVar2 = lVar2 + 1;
    pEVar1 = pEVar1 + 1;
  }
  return pEVar1;
}

Assistant:

const Descriptor::ExtensionRange*
Descriptor::FindExtensionRangeContainingNumber(int number) const {
  // Linear search should be fine because we don't expect a message to have
  // more than a couple extension ranges.
  for (int i = 0; i < extension_range_count(); i++) {
    if (number >= extension_range(i)->start &&
        number <  extension_range(i)->end) {
      return extension_range(i);
    }
  }
  return NULL;
}